

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

char * __thiscall cmState::GetCacheEntryValue(cmState *this,string *key)

{
  CacheEntry *pCVar1;
  pointer pcVar2;
  
  pCVar1 = cmCacheManager::GetCacheEntry(this->CMakeInstance->CacheManager,key);
  if (pCVar1 == (CacheEntry *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = (pCVar1->Value)._M_dataplus._M_p;
  }
  return pcVar2;
}

Assistant:

const char* cmState::GetCacheEntryValue(std::string const& key) const
{
  cmCacheManager::CacheEntry* e = this->CMakeInstance->GetCacheManager()
             ->GetCacheEntry(key);
  if (!e)
    {
    return 0;
    }
  return e->Value.c_str();
}